

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Backpack.cpp
# Opt level: O0

int __thiscall Backpack::remove(Backpack *this,char *__filename)

{
  iterator iVar1;
  ostream *poVar2;
  __normal_iterator<BackpackEntry_**,_std::vector<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>_>
  local_40;
  __normal_iterator<BackpackEntry_**,_std::vector<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>_>
  local_38;
  __normal_iterator<BackpackEntry_**,_std::vector<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>_>
  local_30;
  const_iterator local_28;
  int local_1c;
  Backpack *pBStack_18;
  int index_local;
  Backpack *this_local;
  
  local_1c = (int)__filename;
  pBStack_18 = this;
  iVar1._M_current =
       (BackpackEntry **)std::operator<<((ostream *)&std::cout,"class:Backpack method:remove\n");
  if (0 < local_1c) {
    iVar1._M_current = (BackpackEntry **)(long)local_1c;
    poVar2 = (ostream *)
             std::vector<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>::size(&this->backpack);
    if (iVar1._M_current <= poVar2) {
      local_40._M_current =
           (BackpackEntry **)
           std::vector<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>::begin(&this->backpack);
      local_38 = __gnu_cxx::
                 __normal_iterator<BackpackEntry_**,_std::vector<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>_>
                 ::operator+(&local_40,(long)local_1c);
      local_30 = __gnu_cxx::
                 __normal_iterator<BackpackEntry_**,_std::vector<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>_>
                 ::operator-(&local_38,1);
      __gnu_cxx::
      __normal_iterator<BackpackEntry*const*,std::vector<BackpackEntry*,std::allocator<BackpackEntry*>>>
      ::__normal_iterator<BackpackEntry**>
                ((__normal_iterator<BackpackEntry*const*,std::vector<BackpackEntry*,std::allocator<BackpackEntry*>>>
                  *)&local_28,&local_30);
      iVar1 = std::vector<BackpackEntry_*,_std::allocator<BackpackEntry_*>_>::erase
                        (&this->backpack,local_28);
      this_local._7_1_ = 1;
      goto LAB_001260f8;
    }
  }
  this_local._7_1_ = 0;
LAB_001260f8:
  return (int)CONCAT71((int7)((ulong)iVar1._M_current >> 8),this_local._7_1_);
}

Assistant:

bool Backpack::remove(int index) {
    std::cout << "class:Backpack method:remove\n";
    if (index <= 0 || index > backpack.size()) {
        return false;
    }
    backpack.erase(backpack.begin() + index - 1);
    return true;
}